

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# connect.c
# Opt level: O3

CURLcode singleipconnect(connectdata *conn,Curl_addrinfo *ai,curl_socket_t *sockp)

{
  curl_sockopt_callback p_Var1;
  Curl_easy *pCVar2;
  _Bool _Var3;
  CURLcode CVar4;
  int iVar5;
  uint uVar6;
  int iVar7;
  if2ip_result_t iVar8;
  size_t sVar9;
  int *piVar10;
  uint *puVar11;
  uint uVar12;
  char *pcVar13;
  char *fmt;
  socklen_t __len;
  byte *__s;
  ushort uVar14;
  undefined8 unaff_R13;
  ulong uVar15;
  Curl_easy *pCVar16;
  timeval tVar17;
  curl_socket_t sockfd;
  Curl_dns_entry *h;
  Curl_sockaddr_storage sa;
  long port;
  char ipaddress [46];
  Curl_sockaddr_ex addr;
  char myhost [256];
  uint local_2b8;
  uint local_2b4;
  Curl_easy *local_2b0;
  ulong local_2a8;
  uint local_29c;
  Curl_dns_entry *local_298;
  int local_290;
  socklen_t local_28c;
  sockaddr local_288;
  undefined8 local_278;
  undefined8 uStack_270;
  undefined8 local_268;
  undefined8 uStack_260;
  undefined8 local_258;
  undefined8 uStack_250;
  undefined8 local_248;
  undefined8 uStack_240;
  undefined8 local_238;
  undefined8 uStack_230;
  undefined8 local_228;
  undefined8 uStack_220;
  undefined8 local_218;
  undefined8 uStack_210;
  long local_200;
  char local_1f8 [48];
  undefined1 local_1c8 [144];
  sockaddr local_138;
  undefined8 local_128;
  undefined8 uStack_120;
  undefined8 local_118;
  undefined8 uStack_110;
  undefined8 local_108;
  undefined8 uStack_100;
  undefined8 local_f8;
  undefined8 uStack_f0;
  undefined8 local_e8;
  undefined8 uStack_e0;
  undefined8 local_d8;
  undefined8 uStack_d0;
  undefined8 local_c8;
  undefined8 uStack_c0;
  
  pCVar16 = conn->data;
  *sockp = -1;
  CVar4 = Curl_socket(conn,ai,(Curl_sockaddr_ex *)local_1c8,(curl_socket_t *)&local_2b8);
  if (CVar4 != CURLE_OK) {
    return CURLE_OK;
  }
  _Var3 = getaddressinfo((sockaddr *)(local_1c8 + 0x10),local_1f8,&local_200);
  if (!_Var3) {
    puVar11 = (uint *)__errno_location();
    uVar12 = *puVar11;
    pcVar13 = Curl_strerror(conn,uVar12);
    Curl_failf(pCVar16,"sa_addr inet_ntop() failed with errno %d: %s",(ulong)uVar12,pcVar13);
    Curl_closesocket(conn,local_2b8);
    return CURLE_OK;
  }
  Curl_infof(pCVar16,"  Trying %s...\n",local_1f8);
  uVar12 = local_2b8;
  if ((local_1c8._0_4_ == 2) && (local_1c8._4_4_ == 1)) {
    if ((pCVar16->set).tcp_nodelay == true) {
      Curl_tcpnodelay(conn,local_2b8);
    }
    if ((pCVar16->set).tcp_keepalive == true) {
      local_138._0_4_ = 1;
      iVar5 = setsockopt(uVar12,1,9,&local_138,4);
      if (iVar5 < 0) {
        pcVar13 = "Failed to set SO_KEEPALIVE on fd %d\n";
      }
      else {
        iVar5 = curlx_sltosi((pCVar16->set).tcp_keepidle);
        local_138._0_4_ = iVar5;
        iVar5 = setsockopt(uVar12,6,4,&local_138,4);
        if (iVar5 < 0) {
          Curl_infof(pCVar16,"Failed to set TCP_KEEPIDLE on fd %d\n",(ulong)uVar12);
        }
        iVar5 = curlx_sltosi((pCVar16->set).tcp_keepintvl);
        local_138._0_4_ = iVar5;
        iVar5 = setsockopt(uVar12,6,5,&local_138,4);
        if (-1 < iVar5) goto LAB_004eaa6c;
        pcVar13 = "Failed to set TCP_KEEPINTVL on fd %d\n";
      }
      Curl_infof(pCVar16,pcVar13,(ulong)uVar12);
    }
  }
LAB_004eaa6c:
  p_Var1 = (pCVar16->set).fsockopt;
  if ((p_Var1 == (curl_sockopt_callback)0x0) ||
     (iVar5 = (*p_Var1)((pCVar16->set).sockopt_client,uVar12,CURLSOCKTYPE_IPCXN), iVar5 == 0)) {
    uVar15 = 0;
  }
  else {
    uVar15 = CONCAT71((int7)((ulong)unaff_R13 >> 8),1);
    if (iVar5 != 2) {
      Curl_closesocket(conn,uVar12);
      return CURLE_ABORTED_BY_CALLBACK;
    }
  }
  if (local_1c8._0_4_ == 2) {
    local_29c = (uint)uVar15;
    uVar6 = Curl_ipv6_scope((sockaddr *)(local_1c8 + 0x10));
    pCVar2 = conn->data;
    local_298 = (Curl_dns_entry *)0x0;
    uVar14 = (pCVar2->set).localport;
    __s = (byte *)(pCVar2->set).str[8];
    if (uVar14 == 0 && __s == (byte *)0x0) {
LAB_004eae52:
      uVar15 = (ulong)local_29c;
      goto LAB_004eae5f;
    }
    local_2a8 = CONCAT44(local_2a8._4_4_,uVar6);
    local_2b4 = uVar12;
    iVar5 = (pCVar2->set).localportrange;
    local_218 = 0;
    uStack_210 = 0;
    local_228 = 0;
    uStack_220 = 0;
    local_238 = 0;
    uStack_230 = 0;
    local_248 = 0;
    uStack_240 = 0;
    local_258 = 0;
    uStack_250 = 0;
    local_268 = 0;
    uStack_260 = 0;
    local_278 = 0;
    uStack_270 = 0;
    local_288.sa_family = 0;
    local_288.sa_data[0] = '\0';
    local_288.sa_data[1] = '\0';
    local_288.sa_data[2] = '\0';
    local_288.sa_data[3] = '\0';
    local_288.sa_data[4] = '\0';
    local_288.sa_data[5] = '\0';
    local_288.sa_data[6] = '\0';
    local_288.sa_data[7] = '\0';
    local_288.sa_data[8] = '\0';
    local_288.sa_data[9] = '\0';
    local_288.sa_data[10] = '\0';
    local_288.sa_data[0xb] = '\0';
    local_288.sa_data[0xc] = '\0';
    local_288.sa_data[0xd] = '\0';
    local_2b0 = pCVar2;
    if ((__s == (byte *)0x0) || (sVar9 = strlen((char *)__s), 0xfe < sVar9)) {
LAB_004ead71:
      local_288.sa_data._0_2_ = uVar14 << 8 | uVar14 >> 8;
      local_288.sa_family = 2;
      __len = 0x10;
LAB_004ead8a:
      iVar7 = bind(local_2b4,&local_288,__len);
      while (iVar7 < 0) {
        if (iVar5 < 2) {
          puVar11 = (uint *)__errno_location();
          pCVar16 = local_2b0;
          uVar12 = *puVar11;
          (local_2b0->state).os_errno = uVar12;
          pcVar13 = Curl_strerror(conn,uVar12);
          fmt = "bind failed with errno %d: %s";
          goto LAB_004eaf8e;
        }
        Curl_infof(local_2b0,"Bind to local port %hu failed, trying next\n",(ulong)uVar14);
        uVar14 = uVar14 + 1;
        if (local_288.sa_family == 2) {
          local_288.sa_data._0_2_ = uVar14 * 0x100 | uVar14 >> 8;
          local_288.sa_family = 2;
        }
        iVar7 = bind(local_2b4,&local_288,__len);
        iVar5 = iVar5 + -1;
      }
      local_28c = 0x80;
      local_138.sa_family = 0;
      local_138.sa_data[0] = '\0';
      local_138.sa_data[1] = '\0';
      local_138.sa_data[2] = '\0';
      local_138.sa_data[3] = '\0';
      local_138.sa_data[4] = '\0';
      local_138.sa_data[5] = '\0';
      local_138.sa_data[6] = '\0';
      local_138.sa_data[7] = '\0';
      local_138.sa_data[8] = '\0';
      local_138.sa_data[9] = '\0';
      local_138.sa_data[10] = '\0';
      local_138.sa_data[0xb] = '\0';
      local_138.sa_data[0xc] = '\0';
      local_138.sa_data[0xd] = '\0';
      local_128 = 0;
      uStack_120 = 0;
      local_118 = 0;
      uStack_110 = 0;
      local_108 = 0;
      uStack_100 = 0;
      local_f8 = 0;
      uStack_f0 = 0;
      local_e8 = 0;
      uStack_e0 = 0;
      local_d8 = 0;
      uStack_d0 = 0;
      local_c8 = 0;
      uStack_c0 = 0;
      iVar5 = getsockname(local_2b4,&local_138,&local_28c);
      if (iVar5 < 0) {
        puVar11 = (uint *)__errno_location();
        pCVar16 = local_2b0;
        uVar12 = *puVar11;
        (local_2b0->state).os_errno = uVar12;
        pcVar13 = Curl_strerror(conn,uVar12);
        fmt = "getsockname() failed with errno %d: %s";
LAB_004eaf8e:
        Curl_failf(pCVar16,fmt,(ulong)uVar12,pcVar13);
LAB_004eafa0:
        Curl_closesocket(conn,local_2b8);
        return CURLE_INTERFACE_FAILED;
      }
      Curl_infof(local_2b0,"Local port: %hu\n",(ulong)uVar14);
      (conn->bits).bound = true;
      uVar12 = local_2b8;
      goto LAB_004eae52;
    }
    memset(&local_138,0,0x100);
    local_290 = *__s - 0x69;
    if ((local_290 == 0) && (local_290 = __s[1] - 0x66, local_290 == 0)) {
      local_290 = 0x21 - (uint)__s[2];
    }
    else {
      local_290 = -local_290;
    }
    if (local_290 != 0) {
      iVar7 = strncmp("host!",(char *)__s,5);
      if (iVar7 != 0) goto LAB_004eabc0;
      __s = __s + 5;
      goto LAB_004eacb9;
    }
    __s = __s + 3;
LAB_004eabc0:
    iVar8 = Curl_if2ip(2,(uint)local_2a8,conn->scope_id,(char *)__s,(char *)&local_138,0x100);
    if (iVar8 == IF2IP_FOUND) {
      Curl_infof(local_2b0,"Local Interface %s is ip %s using address family %i\n",__s,&local_138,2)
      ;
      sVar9 = strlen((char *)__s);
      iVar7 = setsockopt(local_2b4,1,0x19,__s,(int)sVar9 + 1);
      if (iVar7 != 0) {
        piVar10 = __errno_location();
        local_2a8 = CONCAT44(local_2a8._4_4_,*piVar10);
        pcVar13 = Curl_strerror(conn,*piVar10);
        Curl_infof(local_2b0,"SO_BINDTODEVICE %s failed with errno %d: %s; will do regular bind\n",
                   __s,local_2a8 & 0xffffffff,pcVar13);
      }
LAB_004ead52:
      iVar7 = inet_pton(2,(char *)&local_138,local_288.sa_data + 2);
      if (0 < iVar7) goto LAB_004ead71;
      __len = 0;
      goto LAB_004ead8a;
    }
    uVar12 = local_2b4;
    if (iVar8 != IF2IP_AF_NOT_SUPPORTED) {
      if (iVar8 == IF2IP_NOT_FOUND) {
        if (local_290 == 0) {
          Curl_failf(local_2b0,"Couldn\'t bind to interface \'%s\'",__s);
          local_2b8 = local_2b4;
          goto LAB_004eafa0;
        }
LAB_004eacb9:
        local_2a8 = conn->ip_version;
        conn->ip_version = 1;
        Curl_resolv(conn,(char *)__s,0,&local_298);
        conn->ip_version = local_2a8;
        if (local_298 != (Curl_dns_entry *)0x0) {
          Curl_printable_address(local_298->addr,(char *)&local_138,0x100);
          Curl_infof(local_2b0,"Name \'%s\' family %i resolved to \'%s\' family %i\n",__s,2,
                     &local_138,(ulong)(uint)local_298->addr->ai_family);
          Curl_resolv_unlock(local_2b0,local_298);
          goto LAB_004ead52;
        }
      }
      else if (local_290 != 0) goto LAB_004eacb9;
      Curl_failf(local_2b0,"Couldn\'t bind to \'%s\'",__s);
      goto LAB_004eafa0;
    }
LAB_004eaf5b:
    Curl_closesocket(conn,uVar12);
    CVar4 = CURLE_COULDNT_CONNECT;
  }
  else {
LAB_004eae5f:
    curlx_nonblock(uVar12,1);
    tVar17 = curlx_tvnow();
    conn->connecttime = tVar17;
    if (1 < conn->num_addr) {
      Curl_expire(pCVar16,conn->timeoutms_per_addr,EXPIRE_DNS_PER_NAME);
    }
    if (((((char)uVar15 == '\0') && (conn->socktype == 1)) &&
        (((conn->bits).tcp_fastopen != true || ((conn->given->flags & 1) != 0)))) &&
       (iVar5 = connect(uVar12,(sockaddr *)(local_1c8 + 0x10),local_1c8._12_4_), iVar5 == -1)) {
      piVar10 = __errno_location();
      iVar5 = *piVar10;
      if ((iVar5 != 0xb) && (iVar5 != 0x73)) {
        pcVar13 = Curl_strerror(conn,iVar5);
        Curl_infof(pCVar16,"Immediate connect fail for %s: %s\n",local_1f8,pcVar13);
        (pCVar16->state).os_errno = iVar5;
        goto LAB_004eaf5b;
      }
    }
    *sockp = uVar12;
    CVar4 = CURLE_OK;
  }
  return CVar4;
}

Assistant:

static CURLcode singleipconnect(struct connectdata *conn,
                                const Curl_addrinfo *ai,
                                curl_socket_t *sockp)
{
  struct Curl_sockaddr_ex addr;
  int rc = -1;
  int error = 0;
  bool isconnected = FALSE;
  struct Curl_easy *data = conn->data;
  curl_socket_t sockfd;
  CURLcode result;
  char ipaddress[MAX_IPADR_LEN];
  long port;
  bool is_tcp;

  *sockp = CURL_SOCKET_BAD;

  result = Curl_socket(conn, ai, &addr, &sockfd);
  if(result)
    /* Failed to create the socket, but still return OK since we signal the
       lack of socket as well. This allows the parent function to keep looping
       over alternative addresses/socket families etc. */
    return CURLE_OK;

  /* store remote address and port used in this connection attempt */
  if(!getaddressinfo((struct sockaddr*)&addr.sa_addr,
                     ipaddress, &port)) {
    /* malformed address or bug in inet_ntop, try next address */
    error = ERRNO;
    failf(data, "sa_addr inet_ntop() failed with errno %d: %s",
          error, Curl_strerror(conn, error));
    Curl_closesocket(conn, sockfd);
    return CURLE_OK;
  }
  infof(data, "  Trying %s...\n", ipaddress);

#ifdef ENABLE_IPV6
  is_tcp = (addr.family == AF_INET || addr.family == AF_INET6) &&
    addr.socktype == SOCK_STREAM;
#else
  is_tcp = (addr.family == AF_INET) && addr.socktype == SOCK_STREAM;
#endif
  if(is_tcp && data->set.tcp_nodelay)
    Curl_tcpnodelay(conn, sockfd);

  nosigpipe(conn, sockfd);

  Curl_sndbufset(sockfd);

  if(is_tcp && data->set.tcp_keepalive)
    tcpkeepalive(data, sockfd);

  if(data->set.fsockopt) {
    /* activate callback for setting socket options */
    error = data->set.fsockopt(data->set.sockopt_client,
                               sockfd,
                               CURLSOCKTYPE_IPCXN);

    if(error == CURL_SOCKOPT_ALREADY_CONNECTED)
      isconnected = TRUE;
    else if(error) {
      Curl_closesocket(conn, sockfd); /* close the socket and bail out */
      return CURLE_ABORTED_BY_CALLBACK;
    }
  }

  /* possibly bind the local end to an IP, interface or port */
  if(addr.family == AF_INET
#ifdef ENABLE_IPV6
     || addr.family == AF_INET6
#endif
    ) {
    result = bindlocal(conn, sockfd, addr.family,
                       Curl_ipv6_scope((struct sockaddr*)&addr.sa_addr));
    if(result) {
      Curl_closesocket(conn, sockfd); /* close socket and bail out */
      if(result == CURLE_UNSUPPORTED_PROTOCOL) {
        /* The address family is not supported on this interface.
           We can continue trying addresses */
        return CURLE_COULDNT_CONNECT;
      }
      return result;
    }
  }

  /* set socket non-blocking */
  (void)curlx_nonblock(sockfd, TRUE);

  conn->connecttime = Curl_tvnow();
  if(conn->num_addr > 1)
    Curl_expire(data, conn->timeoutms_per_addr, EXPIRE_DNS_PER_NAME);

  /* Connect TCP sockets, bind UDP */
  if(!isconnected && (conn->socktype == SOCK_STREAM)) {
    if(conn->bits.tcp_fastopen) {
#if defined(CONNECT_DATA_IDEMPOTENT) /* OS X */
      sa_endpoints_t endpoints;
      endpoints.sae_srcif = 0;
      endpoints.sae_srcaddr = NULL;
      endpoints.sae_srcaddrlen = 0;
      endpoints.sae_dstaddr = &addr.sa_addr;
      endpoints.sae_dstaddrlen = addr.addrlen;

      rc = connectx(sockfd, &endpoints, SAE_ASSOCID_ANY,
                    CONNECT_RESUME_ON_READ_WRITE | CONNECT_DATA_IDEMPOTENT,
                    NULL, 0, NULL, NULL);
#elif defined(MSG_FASTOPEN) /* Linux */
      if(conn->given->flags & PROTOPT_SSL)
        rc = connect(sockfd, &addr.sa_addr, addr.addrlen);
      else
        rc = 0; /* Do nothing */
#endif
    }
    else {
      rc = connect(sockfd, &addr.sa_addr, addr.addrlen);
    }

    if(-1 == rc)
      error = SOCKERRNO;
  }
  else {
    *sockp = sockfd;
    return CURLE_OK;
  }

#ifdef ENABLE_IPV6
  conn->bits.ipv6 = (addr.family == AF_INET6)?TRUE:FALSE;
#endif

  if(-1 == rc) {
    switch(error) {
    case EINPROGRESS:
    case EWOULDBLOCK:
#if defined(EAGAIN)
#if (EAGAIN) != (EWOULDBLOCK)
      /* On some platforms EAGAIN and EWOULDBLOCK are the
       * same value, and on others they are different, hence
       * the odd #if
       */
    case EAGAIN:
#endif
#endif
      result = CURLE_OK;
      break;

    default:
      /* unknown error, fallthrough and try another address! */
      infof(data, "Immediate connect fail for %s: %s\n",
            ipaddress, Curl_strerror(conn, error));
      data->state.os_errno = error;

      /* connect failed */
      Curl_closesocket(conn, sockfd);
      result = CURLE_COULDNT_CONNECT;
    }
  }

  if(!result)
    *sockp = sockfd;

  return result;
}